

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O2

bool __thiscall
DIS::LinearObjectStatePdu::operator==(LinearObjectStatePdu *this,LinearObjectStatePdu *rhs)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  pointer pLVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  size_t idx;
  ulong uVar12;
  long lVar13;
  
  bVar6 = SyntheticEnvironmentFamilyPdu::operator==
                    (&this->super_SyntheticEnvironmentFamilyPdu,
                     &rhs->super_SyntheticEnvironmentFamilyPdu);
  bVar7 = EntityID::operator==(&this->_objectID,&rhs->_objectID);
  bVar8 = EntityID::operator==(&this->_referencedObjectID,&rhs->_referencedObjectID);
  uVar3 = this->_updateNumber;
  uVar4 = rhs->_updateNumber;
  uVar1 = rhs->_forceID;
  uVar2 = this->_forceID;
  bVar9 = SimulationAddress::operator==(&this->_requesterID,&rhs->_requesterID);
  bVar10 = SimulationAddress::operator==(&this->_receivingID,&rhs->_receivingID);
  bVar11 = ObjectType::operator==(&this->_objectType,&rhs->_objectType);
  bVar6 = ((bVar11 && (bVar10 && bVar9)) && uVar2 == uVar1) &&
          (uVar3 == uVar4 && (bVar8 && (bVar7 && bVar6)));
  lVar13 = 0;
  for (uVar12 = 0;
      pLVar5 = (this->_linearSegmentParameters).
               super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)(((long)(this->_linearSegmentParameters).
                              super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5) / 0x68);
      uVar12 = uVar12 + 1) {
    bVar7 = LinearSegmentParameter::operator==
                      ((LinearSegmentParameter *)
                       ((long)&((LinearSegmentParameter *)(&pLVar5->_segmentAppearance + -1))->
                               _segmentAppearance + lVar13 + 0xfffffffffffffff0U),
                       (LinearSegmentParameter *)
                       ((long)&((LinearSegmentParameter *)
                               (&((rhs->_linearSegmentParameters).
                                  super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_segmentAppearance +
                               -1))->_segmentAppearance + lVar13 + 0xfffffffffffffff0U));
    bVar6 = (bool)(bVar6 & bVar7);
    lVar13 = lVar13 + 0x68;
  }
  return bVar6;
}

Assistant:

bool LinearObjectStatePdu::operator ==(const LinearObjectStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SyntheticEnvironmentFamilyPdu::operator==(rhs);

     if( ! (_objectID == rhs._objectID) ) ivarsEqual = false;
     if( ! (_referencedObjectID == rhs._referencedObjectID) ) ivarsEqual = false;
     if( ! (_updateNumber == rhs._updateNumber) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_requesterID == rhs._requesterID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_objectType == rhs._objectType) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _linearSegmentParameters.size(); idx++)
     {
        if( ! ( _linearSegmentParameters[idx] == rhs._linearSegmentParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }